

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_cstring
          (PrintfArgFormatter<wchar_t> *this,char *value)

{
  FormatSpec *pFVar1;
  StringValue<char> SStack_18;
  
  if (value == (char *)0x0) {
    pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
             spec_;
    if (pFVar1->type_ == 'p') {
      pFVar1->type_ = '\0';
      SStack_18.size = 0x168d4c;
    }
    else {
      SStack_18.size = 0x1629a0;
    }
    BasicWriter<wchar_t>::write_str<char>
              ((this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
               writer_,(StringValue<char> *)&SStack_18.size,pFVar1);
    return;
  }
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).spec_
  ;
  if (pFVar1->type_ == 'p') {
    pFVar1->flags_ = 8;
    pFVar1->type_ = 'x';
    SStack_18.value = *(char **)&(pFVar1->super_AlignSpec).super_WidthSpec;
    SStack_18.size = *(size_t *)&(pFVar1->super_AlignSpec).align_;
    BasicWriter<wchar_t>::write_int<unsigned_long,fmt::FormatSpec>
              ((this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
               writer_,(unsigned_long)value,*pFVar1);
    return;
  }
  SStack_18.value = value;
  if (value == (char *)0x0) {
    SStack_18.size = 0;
  }
  else {
    SStack_18.size = strlen(value);
  }
  BasicWriter<wchar_t>::write_str<char>
            ((this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
             writer_,&SStack_18,
             (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
             spec_);
  return;
}

Assistant:

void visit_cstring(const char *value) {
    if (value)
      Base::visit_cstring(value);
    else if (this->spec().type_ == 'p')
      write_null_pointer();
    else
      this->write("(null)");
  }